

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O0

string * __thiscall
cppwinrt::
get_impl_name<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,cppwinrt *this,
          basic_string_view<char,_std::char_traits<char>_> *first,
          basic_string_view<char,_std::char_traits<char>_> *rest)

{
  string *local_48;
  anon_class_8_1_6971b95b convert;
  string result;
  basic_string_view<char,_std::char_traits<char>_> *rest_local;
  basic_string_view<char,_std::char_traits<char>_> *first_local;
  
  ::std::__cxx11::string::string((string *)&convert);
  local_48 = (string *)&convert;
  get_impl_name<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
  ::{lambda(auto:1&&)#1}::operator()
            ((_lambda_auto_1____1_ *)&local_48,
             (basic_string_view<char,_std::char_traits<char>_> *)this);
  ::std::__cxx11::string::operator+=((string *)&convert,'_');
  get_impl_name<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
  ::{lambda(auto:1&&)#1}::operator()((_lambda_auto_1____1_ *)&local_48,first);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&convert);
  ::std::__cxx11::string::~string((string *)&convert);
  return __return_storage_ptr__;
}

Assistant:

auto get_impl_name(First const& first, Rest const&... rest)
    {
        std::string result;

        auto convert = [&](auto&& value)
        {
            for (auto&& c : value)
            {
                result += c == '.' ? '_' : c;
            }
        };

        convert(first);
        ((result += '_', convert(rest)), ...);
        return result;
    }